

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  Layer *pLVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 uVar19;
  undefined4 uVar20;
  bool bVar21;
  Mat *pMVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  undefined4 *puVar36;
  int x;
  int iVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  undefined1 (*pauVar42) [16];
  byte bVar43;
  int iVar44;
  ulong uVar45;
  void *pvVar46;
  ulong uVar47;
  uint _elempack;
  long lVar48;
  uint uVar49;
  undefined1 auVar50 [16];
  undefined1 extraout_var [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  float fVar59;
  float fVar60;
  float fVar61;
  v4sf one;
  float fVar62;
  float fVar63;
  float fVar71;
  float fVar72;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar73;
  undefined1 auVar67 [16];
  float fVar64;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  ulong local_2b0;
  ulong local_298;
  undefined8 uStack_290;
  Mat local_238;
  Mat *local_1e8;
  ulong local_1e0;
  void *local_1d8;
  ulong local_1d0;
  Option opt_p;
  Mat local_170;
  long local_128;
  long local_120;
  void *local_118;
  void *local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  iVar44 = bottom_blob->w;
  iVar32 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  uVar33 = (ulong)uVar4;
  iVar31 = bottom_blob->elempack;
  iVar37 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar49 = (this->super_DeconvolutionDepthWise).num_output;
  iVar38 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar40 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  iVar26 = (this->super_DeconvolutionDepthWise).stride_h;
  bVar43 = (uVar49 & 3) == 0 & opt->use_packing_layout;
  iVar41 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar5 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar30 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  uStack_290 = local_298;
  local_298 = (long)iVar31;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (long)iVar31;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = bottom_blob->elemsize;
  uVar45 = SUB168(auVar15 / auVar14,0) << bVar43 * '\x02';
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  auVar55._0_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_left);
  auVar55._4_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_right);
  auVar55._8_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_top);
  auVar55._12_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_bottom);
  iVar25 = movmskps(SUB164(auVar15 / auVar14,0),auVar55);
  lVar48 = 0x10;
  if ((iVar25 == 0) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar48 = 8, &local_238 != top_blob))
     )) {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_238.data = top_blob->data;
    local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_238.elemsize = top_blob->elemsize;
    local_238.elempack = top_blob->elempack;
    local_238.allocator = top_blob->allocator;
    uVar19 = top_blob->dims;
    uVar20 = top_blob->w;
    local_238.h = top_blob->h;
    local_238.d = top_blob->d;
    local_238.c = top_blob->c;
    local_238.cstep = top_blob->cstep;
    uVar49 = (this->super_DeconvolutionDepthWise).num_output;
    local_238.dims = uVar19;
    local_238.w = uVar20;
  }
  iVar37 = (iVar41 + -1) * iVar37;
  iVar41 = iVar5 + (iVar44 + -1) * iVar38 + iVar37 + 1;
  iVar38 = iVar30 + 1 + (iVar32 + -1) * iVar26 + iVar40;
  _elempack = (uint)bVar43 + (uint)bVar43 * 2 + 1;
  local_1e8 = top_blob;
  Mat::create(&local_238,iVar41,iVar38,(int)uVar49 / (int)_elempack,uVar45,_elempack,
              *(Allocator **)(&opt->lightmode + lVar48));
  auVar15 = _DAT_00537830;
  auVar14 = _DAT_005377f0;
  local_110 = local_238.data;
  if ((local_238.data != (void *)0x0) && ((long)local_238.c * local_238.cstep != 0)) {
    iVar26 = (this->super_DeconvolutionDepthWise).num_output;
    iVar5 = (this->super_DeconvolutionDepthWise).group;
    if (iVar5 == iVar26 && iVar31 * uVar4 == iVar5) {
      iVar26 = (this->super_DeconvolutionDepthWise).kernel_h *
               (this->super_DeconvolutionDepthWise).kernel_w;
      if (iVar31 == 1) {
        lVar48 = local_238.cstep * local_238.elemsize;
        local_1d8 = (this->weight_data_tm).data;
        iVar31 = bottom_blob->w;
        local_118 = bottom_blob->data;
        sVar9 = bottom_blob->elemsize;
        local_120 = bottom_blob->cstep * sVar9;
        uVar45 = 0;
        if (iVar41 < 1) {
          iVar41 = 0;
        }
        if (iVar38 < 1) {
          iVar38 = 0;
        }
        if ((int)uVar4 < 1) {
          uVar33 = uVar45;
        }
        local_128 = (long)iVar26 << 2;
        for (; pvVar11 = local_118, uVar45 != uVar33; uVar45 = uVar45 + 1) {
          puVar36 = (undefined4 *)(lVar48 * uVar45 + (long)local_110);
          lVar34 = local_120 * uVar45;
          local_1e0 = uVar45;
          for (iVar26 = 0; iVar26 != iVar38; iVar26 = iVar26 + 1) {
            uVar4 = (this->super_DeconvolutionDepthWise).kernel_h;
            local_1d0 = CONCAT44(local_1d0._4_4_,(this->super_DeconvolutionDepthWise).bias_term);
            pvVar12 = (this->super_DeconvolutionDepthWise).bias_data.data;
            iVar5 = (this->super_DeconvolutionDepthWise).activation_type;
            pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
            iVar30 = 0;
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            iVar25 = -iVar37;
            for (; uVar35 = local_1e0, iVar30 != iVar41; iVar30 = iVar30 + 1) {
              if ((int)local_1d0 == 0) {
                auVar58 = ZEXT812(0);
              }
              else {
                auVar58._4_8_ = 0;
                auVar58._0_4_ = *(uint *)((long)pvVar12 + uVar45 * 4);
              }
              auVar50._12_4_ = 0;
              auVar50._0_12_ = auVar58;
              iVar6 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar49 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar45 = 0;
              if (0 < (int)uVar49) {
                uVar45 = (ulong)uVar49;
              }
              iVar7 = (this->super_DeconvolutionDepthWise).stride_w;
              pvVar46 = local_1d8;
              for (uVar47 = 0; fVar59 = auVar50._0_4_, uVar47 != uVar4; uVar47 = uVar47 + 1) {
                iVar27 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar47 +
                         (iVar26 - iVar40);
                if ((-1 < iVar27) &&
                   (iVar28 = iVar27 / iVar6, iVar28 < iVar32 && iVar27 % iVar6 == 0)) {
                  iVar27 = iVar25;
                  for (uVar39 = 0; uVar45 != uVar39; uVar39 = uVar39 + 1) {
                    if ((-1 < iVar27) &&
                       (iVar29 = iVar27 / iVar7, iVar29 < iVar44 && iVar27 % iVar7 == 0)) {
                      auVar50._0_4_ =
                           auVar50._0_4_ +
                           *(float *)((long)pvVar46 + uVar39 * 4) *
                           *(float *)((long)pvVar11 +
                                     (long)iVar29 * 4 + (long)iVar28 * (long)iVar31 * sVar9 + lVar34
                                     );
                    }
                    iVar27 = iVar27 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar46 = (void *)((long)pvVar46 + (long)(int)uVar49 * 4);
              }
              auVar53 = auVar50;
              switch(iVar5) {
              case 1:
                if (fVar59 <= 0.0) {
                  auVar69._12_4_ = 0;
                  auVar69._0_12_ = auVar50._4_12_;
                  auVar53 = auVar69 << 0x20;
                }
                break;
              case 2:
                auVar53 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar59) & (uint)*pfVar1 |
                                                -(uint)(0.0 < fVar59) & 0x3f800000) * fVar59));
                break;
              case 3:
                if (fVar59 <= *pfVar1) {
                  auVar50._0_4_ = *pfVar1;
                }
                fVar59 = pfVar1[1];
                auVar53 = auVar50;
                if (fVar59 < auVar50._0_4_) {
LAB_003e53ea:
                  auVar53 = ZEXT416((uint)fVar59);
                }
                break;
              case 4:
                if (88.37626 <= fVar59) {
                  fVar59 = 88.37626;
                }
                fVar59 = expf((float)(-(uint)(fVar59 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar59 < -88.37626) & (uint)-fVar59));
                auVar53 = ZEXT416((uint)(1.0 / (fVar59 + 1.0)));
                break;
              case 5:
                fVar60 = expf(fVar59);
                fVar60 = logf(fVar60 + 1.0);
                fVar60 = tanhf(fVar60);
                auVar53._0_4_ = fVar60 * fVar59;
                auVar53._4_12_ = extraout_var;
                break;
              case 6:
                fVar60 = *pfVar1;
                fVar61 = -pfVar1[1] / fVar60;
                auVar53 = (undefined1  [16])0x0;
                if ((fVar61 <= fVar59) && (auVar53 = auVar50, fVar59 <= fVar61 + 1.0 / fVar60)) {
                  fVar59 = (fVar60 * fVar59 + pfVar1[1]) * fVar59;
                  goto LAB_003e53ea;
                }
              }
              *puVar36 = auVar53._0_4_;
              puVar36 = puVar36 + 1;
              iVar25 = iVar25 + 1;
              uVar45 = uVar35;
            }
          }
          local_1d8 = (void *)((long)local_1d8 + local_128);
        }
      }
      else if (iVar31 == 4) {
        if (iVar41 < 1) {
          iVar41 = 0;
        }
        if (iVar38 < 1) {
          iVar38 = 0;
        }
        if ((int)uVar4 < 1) {
          uVar33 = 0;
        }
        auVar50 = (undefined1  [16])0x0;
        fVar59 = (float)DAT_00537830;
        fVar60 = DAT_00537830._4_4_;
        fVar61 = DAT_00537830._8_4_;
        fVar62 = DAT_00537830._12_4_;
        iVar31 = 0;
        uVar45 = 0;
        auVar55 = _DAT_00537800;
        while (uVar35 = uVar45, uVar35 != uVar33) {
          local_1e0 = CONCAT44(local_1e0._4_4_,iVar31);
          pauVar42 = (undefined1 (*) [16])
                     (local_238.cstep * uVar35 * local_238.elemsize + (long)local_238.data);
          iVar5 = bottom_blob->w;
          sVar9 = bottom_blob->cstep;
          sVar10 = bottom_blob->elemsize;
          pvVar11 = bottom_blob->data;
          local_1d8 = (void *)(uVar35 * 0x10);
          pvVar12 = (this->weight_data_tm).data;
          for (iVar30 = 0; iVar30 != iVar38; iVar30 = iVar30 + 1) {
            local_298._0_4_ = -iVar37;
            for (iVar25 = 0; iVar25 != iVar41; iVar25 = iVar25 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar53 = ZEXT816(0);
              }
              else {
                auVar53 = *(undefined1 (*) [16])
                           ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                           (long)local_1d8);
              }
              iVar6 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar4 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar49 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar45 = 0;
              if (0 < (int)uVar4) {
                uVar45 = (ulong)uVar4;
              }
              iVar7 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              pvVar46 = (void *)((long)iVar31 * 4 + (long)pvVar12);
              for (uVar47 = 0; uVar47 != uVar49; uVar47 = uVar47 + 1) {
                iVar27 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar47 +
                         (iVar30 - iVar40);
                if ((-1 < iVar27) &&
                   (iVar28 = iVar27 / iVar6, iVar28 < iVar32 && iVar27 % iVar6 == 0)) {
                  iVar27 = (int)local_298;
                  for (lVar48 = 0; uVar45 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    auVar51 = auVar53;
                    if ((-1 < iVar27) &&
                       (iVar29 = iVar27 / iVar7, iVar29 < iVar44 && iVar27 % iVar7 == 0)) {
                      auVar69 = *(undefined1 (*) [16])
                                 ((long)pvVar11 +
                                 (long)(iVar29 << 2) * 4 +
                                 (long)iVar28 * (long)iVar5 * sVar10 + sVar9 * uVar35 * sVar10);
                      pfVar1 = (float *)((long)pvVar46 + lVar48);
                      auVar51._0_4_ = auVar53._0_4_ + *pfVar1 * auVar69._0_4_;
                      auVar51._4_4_ = auVar53._4_4_ + pfVar1[1] * auVar69._4_4_;
                      auVar51._8_4_ = auVar53._8_4_ + pfVar1[2] * auVar69._8_4_;
                      auVar51._12_4_ = auVar53._12_4_ + pfVar1[3] * auVar69._12_4_;
                    }
                    iVar27 = iVar27 + (this->super_DeconvolutionDepthWise).dilation_w;
                    auVar53 = auVar51;
                  }
                }
                pvVar46 = (void *)((long)pvVar46 + (long)(int)uVar4 * 0x10);
              }
              iVar6 = (this->super_DeconvolutionDepthWise).activation_type;
              fVar54 = auVar53._8_4_;
              fVar64 = auVar53._12_4_;
              auVar65 = auVar53;
              if (5 < iVar6 - 1U) goto switchD_003e4759_caseD_1;
              auVar65 = maxps(auVar53,auVar50);
              switch(iVar6) {
              case 2:
                auVar53 = minps(auVar53,auVar50);
                fVar54 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar66._0_4_ = auVar65._0_4_ + fVar54 * auVar53._0_4_;
                auVar66._4_4_ = auVar65._4_4_ + fVar54 * auVar53._4_4_;
                auVar66._8_4_ = auVar65._8_4_ + fVar54 * auVar53._8_4_;
                auVar66._12_4_ = auVar65._12_4_ + fVar54 * auVar53._12_4_;
                auVar65 = auVar66;
                break;
              case 3:
                puVar36 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar2 = *puVar36;
                uVar3 = puVar36[1];
                auVar57._4_4_ = uVar2;
                auVar57._0_4_ = uVar2;
                auVar57._8_4_ = uVar2;
                auVar57._12_4_ = uVar2;
                auVar67._4_4_ = uVar3;
                auVar67._0_4_ = uVar3;
                auVar67._8_4_ = uVar3;
                auVar67._12_4_ = uVar3;
                auVar53 = maxps(auVar53,auVar57);
                auVar65 = minps(auVar53,auVar67);
                break;
              case 4:
                auVar52._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
                auVar52._8_4_ = -fVar54;
                auVar52._12_4_ = -fVar64;
                auVar53 = minps(auVar52,auVar14);
                auVar53 = maxps(auVar53,auVar55);
                fVar64 = auVar53._0_4_ * 1.442695 + 0.5;
                fVar75 = auVar53._4_4_ * 1.442695 + 0.5;
                fVar77 = auVar53._8_4_ * 1.442695 + 0.5;
                fVar71 = auVar53._12_4_ * 1.442695 + 0.5;
                fVar54 = (float)(int)fVar64;
                fVar74 = (float)(int)fVar75;
                fVar76 = (float)(int)fVar77;
                fVar63 = (float)(int)fVar71;
                fVar54 = fVar54 - (float)(-(uint)(fVar64 < fVar54) & (uint)fVar59);
                fVar74 = fVar74 - (float)(-(uint)(fVar75 < fVar74) & (uint)fVar60);
                fVar76 = fVar76 - (float)(-(uint)(fVar77 < fVar76) & (uint)fVar61);
                fVar63 = fVar63 - (float)(-(uint)(fVar71 < fVar63) & (uint)fVar62);
                fVar64 = fVar54 * -0.6931472 + auVar53._0_4_;
                fVar75 = fVar74 * -0.6931472 + auVar53._4_4_;
                fVar77 = fVar76 * -0.6931472 + auVar53._8_4_;
                fVar71 = fVar63 * -0.6931472 + auVar53._12_4_;
                auVar18._4_4_ =
                     (float)((int)fVar74 * 0x800000 + (int)fVar60) *
                     (fVar75 + fVar60 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar60;
                auVar18._0_4_ =
                     (float)((int)fVar54 * 0x800000 + (int)fVar59) *
                     (fVar64 + fVar59 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64) +
                     fVar59;
                auVar18._8_4_ =
                     (float)((int)fVar76 * 0x800000 + (int)fVar61) *
                     (fVar77 + fVar61 +
                     (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77 +
                       0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                     fVar61;
                auVar18._12_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar62) *
                     (fVar71 + fVar62 +
                     (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                       0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                     fVar62;
                auVar65 = divps(auVar15,auVar18);
                break;
              case 5:
                auVar50 = minps(auVar53,auVar14);
                auVar55 = maxps(auVar50,auVar55);
                fVar74 = auVar55._0_4_ * 1.442695 + 0.5;
                fVar75 = auVar55._4_4_ * 1.442695 + 0.5;
                fVar76 = auVar55._8_4_ * 1.442695 + 0.5;
                fVar77 = auVar55._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar72 = (float)(int)fVar76;
                fVar73 = (float)(int)fVar77;
                fVar63 = fVar63 - (float)(-(uint)(fVar74 < fVar63) & (uint)fVar59);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar60);
                fVar72 = fVar72 - (float)(-(uint)(fVar76 < fVar72) & (uint)fVar61);
                fVar73 = fVar73 - (float)(-(uint)(fVar77 < fVar73) & (uint)fVar62);
                fVar74 = auVar55._0_4_ - fVar63 * 0.6931472;
                fVar75 = auVar55._4_4_ - fVar71 * 0.6931472;
                fVar76 = auVar55._8_4_ - fVar72 * 0.6931472;
                fVar77 = auVar55._12_4_ - fVar73 * 0.6931472;
                auVar78._0_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar59) *
                     (fVar74 + fVar59 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                     fVar59;
                auVar78._4_4_ =
                     (float)((int)fVar71 * 0x800000 + (int)fVar60) *
                     (fVar75 + fVar60 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar60;
                auVar78._8_4_ =
                     (float)((int)fVar72 * 0x800000 + (int)fVar61) *
                     (fVar76 + fVar61 +
                     (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                       0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76) +
                     fVar61;
                auVar78._12_4_ =
                     (float)((int)fVar73 * 0x800000 + (int)fVar62) *
                     (fVar77 + fVar62 +
                     (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77 +
                       0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                     fVar62;
                auVar55 = maxps(auVar78,_DAT_005378a0);
                fVar74 = (float)(auVar55._0_4_ & 0x807fffff | 0x3f000000);
                fVar76 = (float)(auVar55._4_4_ & 0x807fffff | 0x3f000000);
                fVar63 = (float)(auVar55._8_4_ & 0x807fffff | 0x3f000000);
                fVar72 = (float)(auVar55._12_4_ & 0x807fffff | 0x3f000000);
                fVar75 = fVar74 + -1.0 + (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar74);
                fVar77 = fVar76 + -1.0 + (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar76);
                fVar71 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                fVar73 = fVar72 + -1.0 + (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar72);
                auVar56._0_8_ =
                     CONCAT44(-(uint)(auVar78._4_4_ <= 0.0),-(uint)(auVar78._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar56._8_4_ = -(uint)(auVar78._8_4_ <= 0.0) & 0x7fffffff;
                auVar56._12_4_ = -(uint)(auVar78._12_4_ <= 0.0) & 0x7fffffff;
                auVar16._4_4_ =
                     ~-(uint)(auVar78._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar55._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                             fVar77 + (((((((((fVar77 * 0.070376836 + -0.1151461) * fVar77 +
                                             0.116769984) * fVar77 + -0.12420141) * fVar77 +
                                           0.14249323) * fVar77 + -0.16668057) * fVar77 + 0.20000714
                                         ) * fVar77 + -0.24999994) * fVar77 + 0.3333333) * fVar77 +
                                      -0.5) * fVar77 * fVar77) * -2.0);
                auVar16._0_4_ =
                     ~-(uint)(auVar78._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar55._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar59)) * 0.6931472 +
                             fVar75 + (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 +
                                             0.116769984) * fVar75 + -0.12420141) * fVar75 +
                                           0.14249323) * fVar75 + -0.16668057) * fVar75 + 0.20000714
                                         ) * fVar75 + -0.24999994) * fVar75 + 0.3333333) * fVar75 +
                                      -0.5) * fVar75 * fVar75) * -2.0);
                auVar16._8_4_ =
                     ~-(uint)(auVar78._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar55._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                             fVar71 + (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 +
                                             0.116769984) * fVar71 + -0.12420141) * fVar71 +
                                           0.14249323) * fVar71 + -0.16668057) * fVar71 + 0.20000714
                                         ) * fVar71 + -0.24999994) * fVar71 + 0.3333333) * fVar71 +
                                      -0.5) * fVar71 * fVar71) * -2.0);
                auVar16._12_4_ =
                     ~-(uint)(auVar78._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar55._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar72 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                             fVar73 + (((((((((fVar73 * 0.070376836 + -0.1151461) * fVar73 +
                                             0.116769984) * fVar73 + -0.12420141) * fVar73 +
                                           0.14249323) * fVar73 + -0.16668057) * fVar73 + 0.20000714
                                         ) * fVar73 + -0.24999994) * fVar73 + 0.3333333) * fVar73 +
                                      -0.5) * fVar73 * fVar73) * -2.0);
                auVar55 = minps(auVar56 | auVar16,auVar14);
                auVar55 = maxps(auVar55,_DAT_00537800);
                fVar74 = auVar55._0_4_ * 1.442695 + 0.5;
                fVar75 = auVar55._4_4_ * 1.442695 + 0.5;
                fVar76 = auVar55._8_4_ * 1.442695 + 0.5;
                fVar77 = auVar55._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar72 = (float)(int)fVar76;
                fVar73 = (float)(int)fVar77;
                fVar63 = fVar63 - (float)(-(uint)(fVar74 < fVar63) & (uint)fVar59);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar60);
                fVar72 = fVar72 - (float)(-(uint)(fVar76 < fVar72) & (uint)fVar61);
                fVar73 = fVar73 - (float)(-(uint)(fVar77 < fVar73) & (uint)fVar62);
                fVar74 = auVar55._0_4_ - fVar63 * 0.6931472;
                fVar75 = auVar55._4_4_ - fVar71 * 0.6931472;
                fVar76 = auVar55._8_4_ - fVar72 * 0.6931472;
                fVar77 = auVar55._12_4_ - fVar73 * 0.6931472;
                auVar50 = ZEXT816(0);
                auVar17._4_4_ =
                     (float)((int)fVar71 * 0x800000 + (int)fVar60) *
                     (fVar75 + fVar60 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar60;
                auVar17._0_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar59) *
                     (fVar74 + fVar59 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                     fVar59;
                auVar17._8_4_ =
                     (float)((int)fVar72 * 0x800000 + (int)fVar61) *
                     (fVar76 + fVar61 +
                     (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                       0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76) +
                     fVar61;
                auVar17._12_4_ =
                     (float)((int)fVar73 * 0x800000 + (int)fVar62) *
                     (fVar77 + fVar62 +
                     (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77 +
                       0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                     fVar62;
                auVar55 = divps(_DAT_005382b0,auVar17);
                auVar70._0_4_ = auVar55._0_4_ + -1.0;
                auVar70._4_4_ = auVar55._4_4_ + -1.0;
                auVar70._8_4_ = auVar55._8_4_ + -1.0;
                auVar70._12_4_ = auVar55._12_4_ + -1.0;
                auVar55 = _DAT_00537800;
                goto LAB_003e4a99;
              case 6:
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                fVar74 = *pfVar1;
                fVar75 = pfVar1[1];
                auVar68._0_4_ = fVar74 * auVar53._0_4_ + fVar75;
                auVar68._4_4_ = fVar74 * auVar53._4_4_ + fVar75;
                auVar68._8_4_ = fVar74 * fVar54 + fVar75;
                auVar68._12_4_ = fVar74 * fVar64 + fVar75;
                auVar69 = maxps(auVar68,auVar50);
                auVar70 = minps(auVar69,auVar15);
LAB_003e4a99:
                auVar65._0_4_ = auVar70._0_4_ * auVar53._0_4_;
                auVar65._4_4_ = auVar70._4_4_ * auVar53._4_4_;
                auVar65._8_4_ = auVar70._8_4_ * fVar54;
                auVar65._12_4_ = auVar70._12_4_ * fVar64;
              }
switchD_003e4759_caseD_1:
              *pauVar42 = auVar65;
              pauVar42 = pauVar42 + 1;
              local_298._0_4_ = (int)local_298 + 1;
            }
          }
          iVar31 = iVar31 + iVar26 * 4;
          local_1d0 = uVar35;
          uVar45 = uVar35 + 1;
        }
      }
    }
    else {
      uVar33 = (long)(int)(iVar31 * uVar4) / (long)iVar5;
      uVar35 = (long)iVar26 / (long)iVar5;
      if (opt->use_packing_layout == true) {
        uVar49 = (uint)((uVar35 & 3) == 0) * 3 + 1;
        uVar4 = (uint)((uVar33 & 3) == 0) * 3 + 1;
      }
      else {
        uVar49 = 1;
        uVar4 = uVar49;
      }
      local_170.data = bottom_blob->data;
      local_170.refcount = bottom_blob->refcount;
      local_170.elemsize = bottom_blob->elemsize;
      local_170.elempack = bottom_blob->elempack;
      local_170.allocator = bottom_blob->allocator;
      local_170.dims = bottom_blob->dims;
      local_170.w = bottom_blob->w;
      local_170.h = bottom_blob->h;
      local_170.d = bottom_blob->d;
      local_170.c = bottom_blob->c;
      local_170.cstep = bottom_blob->cstep;
      if (local_170.refcount != (int *)0x0) {
        LOCK();
        *local_170.refcount = *local_170.refcount + 1;
        UNLOCK();
      }
      local_2b0 = uVar33 & 0xffffffff;
      uVar47 = local_2b0;
      iVar44 = (int)uVar35;
      if ((int)uVar4 < iVar31) {
        opt_p.lightmode = opt->lightmode;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_ops = opt->use_subgroup_ops;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.vulkan_device_index = opt->vulkan_device_index;
        opt_p.use_reserved_1 = opt->use_reserved_1;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_2 = opt->use_reserved_2;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_fp16_uniform = opt->use_fp16_uniform;
        opt_p.use_int8_uniform = opt->use_int8_uniform;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_170,uVar4,&opt_p);
        if (local_170.data == (void *)0x0) {
          iVar32 = -100;
          bVar21 = false;
        }
        else {
          if ((long)local_170.c * local_170.cstep != 0) goto LAB_003e4c2f;
          bVar21 = false;
          iVar32 = -100;
        }
      }
      else {
LAB_003e4c2f:
        sVar9 = local_238.cstep;
        opt_p.blob_allocator =
             (Allocator *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        opt_p._0_8_ = local_238.data;
        opt_p.workspace_allocator = (Allocator *)local_238.elemsize;
        opt_p.openmp_blocktime = local_238.elempack;
        opt_p._32_8_ = local_238.allocator;
        opt_p._44_4_ = local_238.w;
        opt_p.vulkan_device_index = local_238.dims;
        opt_p._48_8_ = local_238._48_8_;
        opt_p.use_winograd43_convolution = (bool)(undefined1)local_238.c;
        opt_p.use_winograd63_convolution = (bool)local_238.c._1_1_;
        opt_p.use_a53_a55_optimized_kernel = (bool)local_238.c._2_1_;
        opt_p.use_fp16_uniform = (bool)local_238.c._3_1_;
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        if ((uVar49 < _elempack) &&
           ((Mat::create((Mat *)&opt_p,iVar41,iVar38,
                         (this->super_DeconvolutionDepthWise).num_output / (int)uVar49,
                         (ulong)uVar49 * (uVar45 >> bVar43 * '\x02'),uVar49,opt->workspace_allocator
                        ), opt_p._0_8_ == 0 || ((long)(int)opt_p._56_4_ * sVar9 == 0)))) {
LAB_003e5490:
          iVar32 = -100;
          bVar21 = false;
        }
        else {
          iVar37 = 0;
          iVar31 = 0;
          lVar48 = 0;
          uVar45 = uVar33;
          do {
            uVar24 = opt_p._48_8_;
            uVar23 = opt_p._40_8_;
            if ((this->super_DeconvolutionDepthWise).group <= lVar48) {
              if (uVar49 < _elempack) {
                convert_packing((Mat *)&opt_p,&local_238,_elempack,opt);
                if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
                goto LAB_003e5490;
              }
              else {
                if (opt_p.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                  UNLOCK();
                }
                piVar8 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
                if (piVar8 != (int *)0x0) {
                  LOCK();
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (*piVar8 == 0) {
                    if (local_238.allocator == (Allocator *)0x0) {
                      free(local_238.data);
                    }
                    else {
                      (*(local_238.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar23 = opt_p._56_8_;
                local_238.data = (void *)opt_p._0_8_;
                local_238.refcount._0_4_ = SUB84(opt_p.blob_allocator,0);
                local_238.refcount._4_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
                local_238.elemsize = (size_t)opt_p.workspace_allocator;
                local_238.elempack = opt_p.openmp_blocktime;
                local_238.allocator = (Allocator *)opt_p._32_8_;
                local_238.dims = opt_p.vulkan_device_index;
                local_238.w = opt_p._44_4_;
                local_238._48_8_ = opt_p._48_8_;
                local_238.c._0_1_ = opt_p.use_winograd43_convolution;
                local_238.c._1_1_ = opt_p.use_winograd63_convolution;
                local_238.c._2_1_ = opt_p.use_a53_a55_optimized_kernel;
                local_238.c._3_1_ = opt_p.use_fp16_uniform;
                local_238.cstep = sVar9;
                opt_p._56_8_ = uVar23;
              }
              iVar32 = -100;
              bVar21 = true;
              goto LAB_003e556f;
            }
            m.c = (int)uVar45 / (int)uVar4;
            m.data = (void *)((long)(iVar37 / (int)uVar4) * local_170.cstep * local_170.elemsize +
                             (long)local_170.data);
            m.refcount = (int *)0x0;
            m.elemsize = local_170.elemsize;
            m.elempack = local_170.elempack;
            m.allocator = local_170.allocator;
            m.w = local_170.w;
            m.h = local_170.h;
            m.d = local_170.d;
            m.cstep = ((long)local_170.d * local_170.elemsize *
                       (long)local_170.h * (long)local_170.w + 0xf & 0xfffffffffffffff0) /
                      local_170.elemsize;
            m.dims = local_170.dims;
            m_1.c = iVar44 / (int)uVar49;
            m_1.data = (void *)((long)(iVar31 / (int)uVar49) * sVar9 *
                                (long)opt_p.workspace_allocator + opt_p._0_8_);
            m_1.refcount = (int *)0x0;
            m_1.elemsize = (size_t)opt_p.workspace_allocator;
            m_1.elempack = opt_p.openmp_blocktime;
            m_1.allocator = (Allocator *)opt_p._32_8_;
            m_1.w._0_1_ = opt_p.use_reserved_1;
            m_1.w._1_1_ = opt_p.use_image_storage;
            m_1.w._2_1_ = opt_p.use_tensor_storage;
            m_1.w._3_1_ = opt_p.use_reserved_2;
            m_1.h = opt_p.flush_denormals;
            m_1.d._0_1_ = opt_p.use_local_pool_allocator;
            m_1.d._1_1_ = opt_p.use_shader_local_memory;
            m_1.d._2_1_ = opt_p.use_cooperative_matrix;
            m_1.d._3_1_ = opt_p.use_winograd23_convolution;
            m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                         (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
            opt_p.vulkan_device_index = (int)uVar23;
            m_1.dims = opt_p.vulkan_device_index;
            pLVar13 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar48];
            opt_g.lightmode = opt->lightmode;
            opt_g.use_shader_pack8 = opt->use_shader_pack8;
            opt_g.use_subgroup_ops = opt->use_subgroup_ops;
            opt_g.use_reserved_0 = opt->use_reserved_0;
            opt_g.num_threads = opt->num_threads;
            opt_g.workspace_allocator = opt->workspace_allocator;
            opt_g.openmp_blocktime = opt->openmp_blocktime;
            opt_g.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g.use_int8_inference = opt->use_int8_inference;
            opt_g.use_vulkan_compute = opt->use_vulkan_compute;
            opt_g.use_bf16_storage = opt->use_bf16_storage;
            opt_g.use_fp16_packed = opt->use_fp16_packed;
            opt_g.use_fp16_storage = opt->use_fp16_storage;
            opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_g.use_int8_packed = opt->use_int8_packed;
            opt_g.use_int8_storage = opt->use_int8_storage;
            opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_g.use_packing_layout = opt->use_packing_layout;
            opt_g.vulkan_device_index = opt->vulkan_device_index;
            opt_g.use_reserved_1 = opt->use_reserved_1;
            opt_g.use_image_storage = opt->use_image_storage;
            opt_g.use_tensor_storage = opt->use_tensor_storage;
            opt_g.use_reserved_2 = opt->use_reserved_2;
            opt_g.flush_denormals = opt->flush_denormals;
            opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
            opt_g.use_shader_local_memory = opt->use_shader_local_memory;
            opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
            opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
            opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
            opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
            opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
            opt_g.use_fp16_uniform = opt->use_fp16_uniform;
            opt_g.use_int8_uniform = opt->use_int8_uniform;
            opt_g.use_reserved_9 = opt->use_reserved_9;
            opt_g.use_reserved_10 = opt->use_reserved_10;
            opt_g.use_reserved_11 = opt->use_reserved_11;
            opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
            opt_p._40_8_ = uVar23;
            opt_p._48_8_ = uVar24;
            iVar32 = (*pLVar13->_vptr_Layer[7])(pLVar13,&m,&m_1,&opt_g);
            local_2b0._0_4_ = (int)uVar33;
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + -1;
              UNLOCK();
              if (*m_1.refcount == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (m.refcount != (int *)0x0) {
              LOCK();
              *m.refcount = *m.refcount + -1;
              UNLOCK();
              if (*m.refcount == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  free(m.data);
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            lVar48 = lVar48 + 1;
            iVar31 = iVar31 + iVar44;
            iVar37 = iVar37 + (int)local_2b0;
            uVar45 = uVar47;
          } while (iVar32 == 0);
          bVar21 = false;
        }
LAB_003e556f:
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
      }
      if (local_170.refcount != (int *)0x0) {
        LOCK();
        *local_170.refcount = *local_170.refcount + -1;
        UNLOCK();
        if (*local_170.refcount == 0) {
          if (local_170.allocator == (Allocator *)0x0) {
            free(local_170.data);
          }
          else {
            (*(local_170.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar21) goto LAB_003e5623;
    }
    pMVar22 = local_1e8;
    DeconvolutionDepthWise::cut_padding
              (&this->super_DeconvolutionDepthWise,&local_238,local_1e8,opt);
    if ((pMVar22->data != (void *)0x0) && (iVar32 = 0, (long)local_1e8->c * local_1e8->cstep != 0))
    goto LAB_003e5623;
  }
  iVar32 = -100;
LAB_003e5623:
  piVar8 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        free(local_238.data);
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}